

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImDrawVert_resize(ImVector_ImDrawVert *self,int new_size)

{
  int new_size_local;
  ImVector_ImDrawVert *self_local;
  
  ImVector<ImDrawVert>::resize(self,new_size);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawVert_resize(ImVector_ImDrawVert* self,int new_size)
{
    return self->resize(new_size);
}